

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXCount.cpp
# Opt level: O2

int main(int argC,char **argV)

{
  bool bVar1;
  int iVar2;
  SAXParser *this;
  ostream *poVar3;
  MemoryManager *pMVar4;
  bool bVar5;
  char *pcVar6;
  char *pcVar7;
  ulong uVar8;
  int local_6d4;
  SAXCountHandlers handler;
  char localeStr [64];
  ifstream fin;
  byte abStack_600 [488];
  char fURI [1000];
  
  if (1 < argC) {
    pcVar6 = localeStr;
    localeStr[0x30] = '\0';
    localeStr[0x31] = '\0';
    localeStr[0x32] = '\0';
    localeStr[0x33] = '\0';
    localeStr[0x34] = '\0';
    localeStr[0x35] = '\0';
    localeStr[0x36] = '\0';
    localeStr[0x37] = '\0';
    localeStr[0x38] = '\0';
    localeStr[0x39] = '\0';
    localeStr[0x3a] = '\0';
    localeStr[0x3b] = '\0';
    localeStr[0x3c] = '\0';
    localeStr[0x3d] = '\0';
    localeStr[0x3e] = '\0';
    localeStr[0x3f] = '\0';
    localeStr[0x20] = '\0';
    localeStr[0x21] = '\0';
    localeStr[0x22] = '\0';
    localeStr[0x23] = '\0';
    localeStr[0x24] = '\0';
    localeStr[0x25] = '\0';
    localeStr[0x26] = '\0';
    localeStr[0x27] = '\0';
    localeStr[0x28] = '\0';
    localeStr[0x29] = '\0';
    localeStr[0x2a] = '\0';
    localeStr[0x2b] = '\0';
    localeStr[0x2c] = '\0';
    localeStr[0x2d] = '\0';
    localeStr[0x2e] = '\0';
    localeStr[0x2f] = '\0';
    localeStr[0x10] = '\0';
    localeStr[0x11] = '\0';
    localeStr[0x12] = '\0';
    localeStr[0x13] = '\0';
    localeStr[0x14] = '\0';
    localeStr[0x15] = '\0';
    localeStr[0x16] = '\0';
    localeStr[0x17] = '\0';
    localeStr[0x18] = '\0';
    localeStr[0x19] = '\0';
    localeStr[0x1a] = '\0';
    localeStr[0x1b] = '\0';
    localeStr[0x1c] = '\0';
    localeStr[0x1d] = '\0';
    localeStr[0x1e] = '\0';
    localeStr[0x1f] = '\0';
    localeStr[0] = '\0';
    localeStr[1] = '\0';
    localeStr[2] = '\0';
    localeStr[3] = '\0';
    localeStr[4] = '\0';
    localeStr[5] = '\0';
    localeStr[6] = '\0';
    localeStr[7] = '\0';
    localeStr[8] = '\0';
    localeStr[9] = '\0';
    localeStr[10] = '\0';
    localeStr[0xb] = '\0';
    localeStr[0xc] = '\0';
    localeStr[0xd] = '\0';
    localeStr[0xe] = '\0';
    localeStr[0xf] = '\0';
    bVar5 = false;
    bVar1 = false;
    for (uVar8 = 1; (uint)argC != uVar8; uVar8 = uVar8 + 1) {
      pcVar7 = argV[uVar8];
      if (*pcVar7 != '-') {
        if (argC != (int)uVar8) {
          if (localeStr[0] == '\0') {
            pcVar6 = (char *)&xercesc_4_0::XMLUni::fgXercescDefaultLocale;
          }
          pMVar4 = (MemoryManager *)0x0;
          xercesc_4_0::XMLPlatformUtils::Initialize
                    (pcVar6,(char *)0x0,(PanicHandler *)0x0,(MemoryManager *)0x0);
          if (bVar5) {
            pMVar4 = xercesc_4_0::XMLPlatformUtils::fgMemoryManager;
            xercesc_4_0::XMLPlatformUtils::recognizeNEL
                      (true,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
          }
          this = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,(ulong)pMVar4);
          xercesc_4_0::SAXParser::SAXParser
                    (this,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                     (XMLGrammarPool *)0x0);
          xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)this);
          bVar5 = SUB81(this,0);
          xercesc_4_0::SAXParser::setDoNamespaces(bVar5);
          xercesc_4_0::SAXParser::setDoSchema(bVar5);
          xercesc_4_0::SAXParser::setHandleMultipleImports(bVar5);
          xercesc_4_0::SAXParser::setValidationSchemaFullChecking(bVar5);
          SAXCountHandlers::SAXCountHandlers(&handler);
          (**(code **)(*(long *)this + 0x20))(this,&handler.super_HandlerBase.super_DocumentHandler)
          ;
          (**(code **)(*(long *)this + 0x28))(this);
          std::ifstream::ifstream(&fin);
          if (bVar1) {
            std::ifstream::open((char *)&fin,(_Ios_Openmode)argV[uVar8]);
          }
          if ((abStack_600[*(long *)(_fin + -0x18)] & 5) == 0) {
            local_6d4 = 0;
            goto LAB_00102788;
          }
          poVar3 = std::operator<<((ostream *)&std::cerr,"Cannot open the list file: ");
          poVar3 = std::operator<<(poVar3,argV[uVar8]);
          std::endl<char,std::char_traits<char>>(poVar3);
          local_6d4 = 2;
          goto LAB_00102a8b;
        }
        break;
      }
      if ((pcVar7[1] == '?') && (pcVar7[2] == '\0')) {
        usage();
        return 2;
      }
      if (((pcVar7[1] == 'v') && (pcVar7[2] == '=')) || ((pcVar7[1] == 'V' && (pcVar7[2] == '='))))
      {
        pcVar7 = pcVar7 + 3;
        iVar2 = strcmp(pcVar7,"never");
        if (((iVar2 != 0) && (iVar2 = strcmp(pcVar7,"auto"), iVar2 != 0)) &&
           (iVar2 = strcmp(pcVar7,"always"), iVar2 != 0)) {
          poVar3 = std::operator<<((ostream *)&std::cerr,"Unknown -v= value: ");
          poVar3 = std::operator<<(poVar3,pcVar7);
          std::endl<char,std::char_traits<char>>(poVar3);
          return 2;
        }
      }
      else if ((((pcVar7[1] != 'n') || (pcVar7[2] != '\0')) &&
               (((pcVar7[1] != 'N' || (pcVar7[2] != '\0')) &&
                ((pcVar7[1] != 's' || (pcVar7[2] != '\0')))))) &&
              (((pcVar7[1] != 'S' || (pcVar7[2] != '\0')) &&
               (((pcVar7[1] != 'f' || (pcVar7[2] != '\0')) &&
                ((pcVar7[1] != 'F' || (pcVar7[2] != '\0')))))))) {
        if (((pcVar7[1] == 'l') && (pcVar7[2] == '\0')) ||
           ((pcVar7[1] == 'L' && (pcVar7[2] == '\0')))) {
          bVar1 = true;
        }
        else {
          iVar2 = strcmp(pcVar7,"-special:nel");
          if (iVar2 == 0) {
            bVar5 = true;
          }
          else {
            iVar2 = strncmp(pcVar7,"-locale=",8);
            if (iVar2 == 0) {
              strcpy(pcVar6,pcVar7 + 8);
            }
            else {
              poVar3 = std::operator<<((ostream *)&std::cerr,"Unknown option \'");
              poVar3 = std::operator<<(poVar3,argV[uVar8]);
              poVar3 = std::operator<<(poVar3,"\', ignoring it\n");
              std::endl<char,std::char_traits<char>>(poVar3);
            }
          }
        }
      }
    }
  }
  usage();
  return 1;
LAB_00102788:
  memset(fURI,0,1000);
  if (bVar1) {
    if ((abStack_600[*(long *)(_fin + -0x18)] & 2) == 0) goto LAB_001027bd;
    std::ifstream::close();
  }
  else {
    iVar2 = (int)uVar8;
    if (iVar2 < argC) {
      pcVar6 = argV[iVar2];
      uVar8 = (ulong)(iVar2 + 1);
      goto LAB_0010282f;
    }
  }
  goto LAB_00102a72;
LAB_001027bd:
  std::istream::getline((char *)&fin,(long)fURI);
  if (fURI[0] != '\0') {
    poVar3 = std::operator<<((ostream *)&std::cerr,"==Parsing== ");
    poVar3 = std::operator<<(poVar3,fURI);
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar6 = fURI;
LAB_0010282f:
    SAXCountHandlers::resetErrors(&handler);
    xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
    (**(code **)(*(long *)this + 0x40))(this);
    xercesc_4_0::XMLPlatformUtils::getCurrentMillis();
    if (handler.fSawErrors == false) {
      poVar3 = std::operator<<((ostream *)&std::cout,pcVar6);
      poVar3 = std::operator<<(poVar3,": ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," ms (");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," elems, ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," attrs, ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," spaces, ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      poVar3 = std::operator<<(poVar3," chars)");
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    else {
      local_6d4 = 1;
    }
  }
  goto LAB_00102788;
LAB_00102a72:
  (**(code **)(*(long *)this + 8))(this);
  xercesc_4_0::XMLPlatformUtils::Terminate();
  local_6d4 = local_6d4 << 2;
LAB_00102a8b:
  std::ifstream::~ifstream(&fin);
  SAXCountHandlers::~SAXCountHandlers(&handler);
  return local_6d4;
}

Assistant:

int main(int argC, char* argV[])
{

    // Check command line and extract arguments.
    if (argC < 2)
    {
        usage();
        return 1;
    }

    const char*              xmlFile = 0;
    SAXParser::ValSchemes    valScheme = SAXParser::Val_Auto;
    bool                     doNamespaces       = false;
    bool                     doSchema           = false;
    bool                     schemaFullChecking = false;
    bool                     doList = false;
    bool                     errorOccurred = false;
    bool                     recognizeNEL = false;
    char                     localeStr[64];
    memset(localeStr, 0, sizeof localeStr);

    int argInd;
    for (argInd = 1; argInd < argC; argInd++)
    {
        // Break out on first parm not starting with a dash
        if (argV[argInd][0] != '-')
            break;

        // Watch for special case help request
        if (!strcmp(argV[argInd], "-?"))
        {
            usage();
            return 2;
        }
         else if (!strncmp(argV[argInd], "-v=", 3)
              ||  !strncmp(argV[argInd], "-V=", 3))
        {
            const char* const parm = &argV[argInd][3];

            if (!strcmp(parm, "never"))
                valScheme = SAXParser::Val_Never;
            else if (!strcmp(parm, "auto"))
                valScheme = SAXParser::Val_Auto;
            else if (!strcmp(parm, "always"))
                valScheme = SAXParser::Val_Always;
            else
            {
                std::cerr << "Unknown -v= value: " << parm << std::endl;
                return 2;
            }
        }
         else if (!strcmp(argV[argInd], "-n")
              ||  !strcmp(argV[argInd], "-N"))
        {
            doNamespaces = true;
        }
         else if (!strcmp(argV[argInd], "-s")
              ||  !strcmp(argV[argInd], "-S"))
        {
            doSchema = true;
        }
         else if (!strcmp(argV[argInd], "-f")
              ||  !strcmp(argV[argInd], "-F"))
        {
            schemaFullChecking = true;
        }
         else if (!strcmp(argV[argInd], "-l")
              ||  !strcmp(argV[argInd], "-L"))
        {
            doList = true;
        }
         else if (!strcmp(argV[argInd], "-special:nel"))
        {
            // turning this on will lead to non-standard compliance behaviour
            // it will recognize the unicode character 0x85 as new line character
            // instead of regular character as specified in XML 1.0
            // do not turn this on unless really necessary
             recognizeNEL = true;
        }
         else if (!strncmp(argV[argInd], "-locale=", 8))
        {
             // Get out the end of line
             strcpy(localeStr, &(argV[argInd][8]));
        }
        else
        {
            std::cerr << "Unknown option '" << argV[argInd]
                << "', ignoring it\n" << std::endl;
        }
    }

    //
    //  There should at least one parameter left, and that
    //  should be the file name(s).
    //
    if (argInd == argC)
    {
        usage();
        return 1;
    }

    // Initialize the XML4C2 system
    try
    {
        if (strlen(localeStr))
        {
            XMLPlatformUtils::Initialize(localeStr);
        }
        else
        {
            XMLPlatformUtils::Initialize();
        }

        if (recognizeNEL)
        {
            XMLPlatformUtils::recognizeNEL(recognizeNEL);
        }
    }

    catch (const XMLException& toCatch)
    {
        std::cerr << "Error during initialization! Message:\n"
            << StrX(toCatch.getMessage()) << std::endl;
        return 1;
    }

    //
    //  Create a SAX parser object. Then, according to what we were told on
    //  the command line, set it to validate or not.
    //
    SAXParser* parser = new SAXParser;

    parser->setValidationScheme(valScheme);
    parser->setDoNamespaces(doNamespaces);
    parser->setDoSchema(doSchema);
    parser->setHandleMultipleImports (true);
    parser->setValidationSchemaFullChecking(schemaFullChecking);

    //
    //  Create our SAX handler object and install it on the parser, as the
    //  document and error handler.
    //
    SAXCountHandlers handler;
    parser->setDocumentHandler(&handler);
    parser->setErrorHandler(&handler);


    //
    //  Get the starting time and kick off the parse of the indicated
    //  file. Catch any exceptions that might propogate out of it.
    //
    unsigned long duration;

    std::ifstream fin;

    // the input is a list file
    if (doList)
        fin.open(argV[argInd]);

    if (fin.fail()) {
        std::cerr <<"Cannot open the list file: " << argV[argInd] << std::endl;
        return 2;
    }

    while (true)
    {
        char fURI[1000];
        //initialize the array to zeros
        memset(fURI,0,sizeof(fURI));

        if (doList) {
            if (! fin.eof() ) {
                fin.getline (fURI, sizeof(fURI));
                if (!*fURI)
                    continue;
                else {
                    xmlFile = fURI;
                    std::cerr << "==Parsing== " << xmlFile << std::endl;
                }
            }
            else
                break;
        }
        else {
            if (argInd < argC)
            {
                 xmlFile = argV[argInd];
                 argInd++;
            }
            else
                break;
        }

        //reset error count first
        handler.resetErrors();

        try
        {
            const unsigned long startMillis = XMLPlatformUtils::getCurrentMillis();
            parser->parse(xmlFile);
            const unsigned long endMillis = XMLPlatformUtils::getCurrentMillis();
            duration = endMillis - startMillis;
        }
        catch (const OutOfMemoryException&)
        {
            std::cerr << "OutOfMemoryException" << std::endl;
            errorOccurred = true;
            continue;
        }
        catch (const XMLException& e)
        {
            std::cerr << "\nError during parsing: '" << xmlFile << "'\n"
                << "Exception message is:  \n"
                << StrX(e.getMessage()) << "\n" << std::endl;
            errorOccurred = true;
            continue;
        }

        catch (...)
        {
            std::cerr << "\nUnexpected exception during parsing: '" << xmlFile << "'\n";
            errorOccurred = true;
            continue;
        }


        // Print out the stats that we collected and time taken
        if (!handler.getSawErrors())
        {
            std::cout << xmlFile << ": " << duration << " ms ("
                << handler.getElementCount() << " elems, "
                << handler.getAttrCount() << " attrs, "
                << handler.getSpaceCount() << " spaces, "
                << handler.getCharacterCount() << " chars)" << std::endl;
        }
        else
            errorOccurred = true;
    }

    if (doList)
        fin.close();

    //
    //  Delete the parser itself.  Must be done prior to calling Terminate, below.
    //
    delete parser;

    // And call the termination method
    XMLPlatformUtils::Terminate();

    if (errorOccurred)
        return 4;
    else
        return 0;

}